

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O0

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,path *name,
          dimension2d<unsigned_int> *size,E_TEXTURE_TYPE type,ECOLOR_FORMAT format,
          COpenGLDriver *driver)

{
  int iVar1;
  bool bVar2;
  undefined4 uVar3;
  GLenum GVar4;
  ECOLOR_FORMAT EVar5;
  u32 uVar6;
  COpenGLCacheHandler *pCVar7;
  STextureCache *this_00;
  undefined8 *in_RDX;
  COpenGLDriver *in_RDI;
  undefined4 in_R8D;
  pointer in_R9;
  double __x;
  double __x_00;
  char msg [256];
  COpenGLCoreTexture<irr::video::COpenGLDriver> *prevTexture;
  undefined4 in_stack_fffffffffffffe88;
  E_TEXTURE_TYPE in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  _func_void_void_ptr_s32_void_ptr **in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  GLint GVar8;
  GLenum *in_stack_fffffffffffffea8;
  OpenGLProcedures *pOVar9;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Printer local_138 [68];
  ESetTextureActive in_stack_ffffffffffffff0c;
  ITexture *in_stack_ffffffffffffff10;
  u32 in_stack_ffffffffffffff1c;
  STextureCache *in_stack_ffffffffffffff20;
  
  IReferenceCounted::IReferenceCounted
            ((IReferenceCounted *)
             &(in_RDI->super_CNullDriver).MaterialRenderers.m_data.
              super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  ITexture::ITexture((ITexture *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98,
                     (path *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe8c);
  (in_RDI->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver = (_func_int **)0x43ce50;
  (in_RDI->super_CNullDriver).MaterialRenderers.m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(vtable + 0x58);
  (in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = in_R9;
  *(undefined4 *)
   &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0xde1;
  *(undefined4 *)
   ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0x1908;
  *(undefined4 *)
   ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0x1908;
  *(undefined4 *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted = 0x1401;
  (in_RDI->super_CNullDriver).CurrentRenderTarget = (IRenderTarget *)0x0;
  *(undefined1 *)&(in_RDI->super_CNullDriver).CurrentRenderTargetSize.Width = 0;
  (in_RDI->super_CNullDriver).SurfaceLoader.m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined4 *)
   &(in_RDI->super_CNullDriver).SurfaceLoader.m_data.
    super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = 0;
  *(undefined1 *)
   ((long)&(in_RDI->super_CNullDriver).SurfaceLoader.m_data.
           super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  core::array<irr::video::IImage_*>::array
            ((array<irr::video::IImage_*> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  *(undefined1 *)
   &(in_RDI->super_CNullDriver).SurfaceWriter.m_data.
    super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&(in_RDI->super_CNullDriver).SurfaceWriter.m_data.
           super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  SStatesCache::SStatesCache
            ((SStatesCache *)
             ((long)&(in_RDI->super_CNullDriver).SurfaceWriter.m_data.
                     super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  uVar3 = (**(code **)&(*(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                         super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)[4].ColorFormat)();
  *(undefined4 *)
   &(in_RDI->super_CNullDriver).RenderTargets.m_data.
    super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = uVar3;
  GVar4 = TextureTypeIrrToGL((COpenGLCoreTexture<irr::video::COpenGLDriver> *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),ETT_2D);
  *(GLenum *)
   &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
    super__Vector_impl_data._M_finish = GVar4;
  (in_RDI->super_CNullDriver).RenderTargets.is_sorted = false;
  (in_RDI->super_CNullDriver).RenderTargets.field_0x19 = 1;
  *(undefined4 *)
   ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
           super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = in_R8D;
  if (*(int *)((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                      super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 4) == 0x11) {
    (**(code **)((long)&(*(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                          super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)[3].NamedPath.Path.str.field_2 +
                8))();
    EVar5 = getBestColorFormat((COpenGLCoreTexture<irr::video::COpenGLDriver> *)
                               CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                               (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    *(ECOLOR_FORMAT *)
     &(in_RDI->super_CNullDriver).RenderTargets.m_data.
      super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = EVar5;
  }
  else {
    *(undefined4 *)
     &(in_RDI->super_CNullDriver).RenderTargets.m_data.
      super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
         *(undefined4 *)
          ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
  *(undefined8 *)&(in_RDI->super_CNullDriver).OcclusionQueries.is_sorted = *in_RDX;
  (in_RDI->super_CNullDriver).RenderTargets.m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       *(pointer *)&(in_RDI->super_CNullDriver).OcclusionQueries.is_sorted;
  EVar5 = *(ECOLOR_FORMAT *)
           &(in_RDI->super_CNullDriver).RenderTargets.m_data.
            super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = IImage::getBitsPerPixelFromFormat
                    (*(ECOLOR_FORMAT *)
                      &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                       super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *(ECOLOR_FORMAT *)
   ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
           super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = EVar5 * uVar6 >> 3;
  bVar2 = COpenGLDriver::getColorFormatParameters
                    (in_RDI,EVar5,
                     (GLint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8,
                     (GLenum *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98);
  if (bVar2) {
    pOVar9 = &GL;
    (*GL.GenTextures)(1,(GLuint *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
    pCVar7 = COpenGLDriver::getCacheHandler
                       ((COpenGLDriver *)
                        (in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                        super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    this_00 = COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              ::getTextureCache(&pCVar7->
                                 super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                               );
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::get(this_00,0);
    pCVar7 = COpenGLDriver::getCacheHandler
                       ((COpenGLDriver *)
                        (in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                        super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::getTextureCache(&pCVar7->
                       super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     );
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    GVar8 = 0x2600;
    (*pOVar9->TexParameteri)
              (*(GLenum *)
                &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0x2801,0x2600);
    (*pOVar9->TexParameteri)
              (*(GLenum *)
                &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0x2800,GVar8);
    GVar8 = 0x812f;
    (*pOVar9->TexParameteri)
              (*(GLenum *)
                &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0x2802,0x812f);
    (*pOVar9->TexParameteri)
              (*(GLenum *)
                &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0x2803,GVar8);
    (*pOVar9->TexParameteri)
              (*(GLenum *)
                &(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                 super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0x8072,GVar8);
    *(undefined1 *)
     ((long)&(in_RDI->super_CNullDriver).SurfaceWriter.m_data.
             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 2;
    *(undefined1 *)
     ((long)&(in_RDI->super_CNullDriver).SurfaceWriter.m_data.
             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 2;
    *(undefined1 *)
     ((long)&(in_RDI->super_CNullDriver).SurfaceWriter.m_data.
             super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 2;
    iVar1 = *(int *)&(in_RDI->super_CNullDriver).SharedRenderTarget;
    if (iVar1 == 0) {
      (*GL.TexImage2D)(0xde1,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                          super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
    }
    else if (iVar1 == 1) {
      (*GL.TexImage2D)(0x8515,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
      (*GL.TexImage2D)(0x8516,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
      (*GL.TexImage2D)(0x8517,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
      (*GL.TexImage2D)(0x8518,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
      (*GL.TexImage2D)(0x8519,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
      (*GL.TexImage2D)(0x851a,0,*(GLint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       *(GLsizei *)
                        &(in_RDI->super_CNullDriver).RenderTargets.m_data.
                         super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       *(GLsizei *)
                        ((long)&(in_RDI->super_CNullDriver).RenderTargets.m_data.
                                super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4),0,
                       *(GLenum *)
                        ((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                       *(GLenum *)&(in_RDI->super_CNullDriver).SharedDepthTextures.is_sorted,
                       (void *)0x0);
    }
    pCVar7 = COpenGLDriver::getCacheHandler
                       ((COpenGLDriver *)
                        (in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                        super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::getTextureCache(&pCVar7->
                       super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                     );
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::STextureCache::set
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff0c);
    bVar2 = COpenGLDriver::testGLError
                      ((COpenGLDriver *)
                       (in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,0xbf);
    if (bVar2) {
      snprintf((char *)local_138,0x100,
               "COpenGLCoreTexture: InternalFormat:0x%04x PixelFormat:0x%04x",
               (ulong)*(uint *)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (ulong)*(uint *)((long)&(in_RDI->super_CNullDriver).SharedDepthTextures.m_data.
                                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      os::Printer::log(local_138,__x_00);
    }
  }
  else {
    os::Printer::log(__x);
  }
  return;
}

Assistant:

COpenGLCoreTexture(const io::path &name, const core::dimension2d<u32> &size, E_TEXTURE_TYPE type, ECOLOR_FORMAT format, TOpenGLDriver *driver) :
			ITexture(name, type),
			Driver(driver), TextureType(GL_TEXTURE_2D),
			TextureName(0), InternalFormat(GL_RGBA), PixelFormat(GL_RGBA), PixelType(GL_UNSIGNED_BYTE), Converter(0), LockReadOnly(false), LockImage(0), LockLayer(0), KeepImage(false),
			MipLevelStored(0), LegacyAutoGenerateMipMaps(false)
	{
		DriverType = Driver->getDriverType();
		TextureType = TextureTypeIrrToGL(Type);
		HasMipMaps = false;
		IsRenderTarget = true;

		OriginalColorFormat = format;

		if (ECF_UNKNOWN == OriginalColorFormat)
			ColorFormat = getBestColorFormat(Driver->getColorFormat());
		else
			ColorFormat = OriginalColorFormat;

		OriginalSize = size;
		Size = OriginalSize;

		Pitch = Size.Width * IImage::getBitsPerPixelFromFormat(ColorFormat) / 8;

		if (!Driver->getColorFormatParameters(ColorFormat, InternalFormat, PixelFormat, PixelType, &Converter)) {
			os::Printer::log("COpenGLCoreTexture: Color format is not supported", ColorFormatNames[ColorFormat < ECF_UNKNOWN ? ColorFormat : ECF_UNKNOWN], ELL_ERROR);
			return;
		}

		GL.GenTextures(1, &TextureName);

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		GL.TexParameteri(TextureType, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

#if defined(GL_VERSION_1_2)
		GL.TexParameteri(TextureType, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
#endif

		StatesCache.WrapU = ETC_CLAMP_TO_EDGE;
		StatesCache.WrapV = ETC_CLAMP_TO_EDGE;
		StatesCache.WrapW = ETC_CLAMP_TO_EDGE;

		switch (Type) {
		case ETT_2D:
			GL.TexImage2D(GL_TEXTURE_2D, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			break;
		case ETT_CUBEMAP:
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			GL.TexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, InternalFormat, Size.Width, Size.Height, 0, PixelFormat, PixelType, 0);
			break;
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
		if (Driver->testGLError(__LINE__)) {
			char msg[256];
			snprintf_irr(msg, 256, "COpenGLCoreTexture: InternalFormat:0x%04x PixelFormat:0x%04x", (int)InternalFormat, (int)PixelFormat);
			os::Printer::log(msg, ELL_ERROR);
		}
	}